

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O2

int32_t __thiscall cab::calculate_costs(cab *this,node_type src,node_type dst)

{
  road_network *prVar1;
  bool bVar2;
  node_type nVar3;
  bool bVar4;
  node_type nVar5;
  pair<bool,_bool> pVar6;
  uint32_t uVar7;
  pointer prVar8;
  request r;
  request local_58;
  uint32_t local_3c;
  pointer local_38;
  
  pVar6 = route_contains_ordered(this,src,dst);
  if (((ushort)pVar6 >> 8 & 1) == 0 || (~pVar6.first & 1U) != 0) {
    local_38 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_3c = 0;
    for (prVar8 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                  super__Vector_impl_data._M_start; prVar8 != local_38; prVar8 = prVar8 + 1) {
      local_58._src = prVar8->_src;
      local_58._dst = prVar8->_dst;
      local_58._2_2_ = *(undefined2 *)&prVar8->field_0x2;
      local_58._passengers = prVar8->_passengers;
      local_58._detours = prVar8->_detours;
      local_58._picked_up = prVar8->_picked_up;
      local_58._13_3_ = *(undefined3 *)&prVar8->field_0xd;
      uVar7 = request::detours(&local_58);
      bVar2 = road_network::is_inner(this->_rnet,src);
      if (((ushort)pVar6 & 1) == 0) {
        prVar1 = this->_rnet;
        nVar5 = this->_position;
        nVar3 = request::src(&local_58);
        bVar4 = road_network::in_between(prVar1,nVar5,nVar3,src);
        if (!bVar4) {
          prVar1 = this->_rnet;
          nVar5 = request::src(&local_58);
          nVar3 = request::dst(&local_58);
          bVar4 = road_network::in_between(prVar1,nVar5,nVar3,src);
          if (!bVar4) goto LAB_0011a3d3;
        }
        uVar7 = (uVar7 - bVar2) + 2;
      }
LAB_0011a3d3:
      bVar2 = road_network::is_inner(this->_rnet,dst);
      if (((ushort)pVar6 >> 8 & 1) == 0) {
        prVar1 = this->_rnet;
        nVar5 = this->_position;
        nVar3 = request::src(&local_58);
        bVar4 = road_network::in_between(prVar1,nVar5,nVar3,dst);
        if (!bVar4) {
          prVar1 = this->_rnet;
          nVar5 = request::src(&local_58);
          nVar3 = request::dst(&local_58);
          bVar4 = road_network::in_between(prVar1,nVar5,nVar3,dst);
          if (!bVar4) goto LAB_0011a464;
        }
        uVar7 = (uVar7 - bVar2) + 2;
      }
LAB_0011a464:
      if (local_3c < uVar7) {
        local_3c = uVar7;
      }
    }
  }
  else {
    local_3c = this->_costs;
  }
  return local_3c;
}

Assistant:

std::int32_t cab::calculate_costs(node_type src, node_type dst)
{
    // check if the cab already has src and dst in that order in its requests
    std::pair<bool, bool> pair = route_contains_ordered(src, dst);
    bool found_src = pair.first;
    bool found_dst = pair.second;

    if(found_src && found_dst)
    {
        return _costs;
    }

    // calculate and return max detour costs
    std::uint32_t max = 0;
    for(auto r : _requests)
    {
        std::uint32_t cost = r.detours();
        bool is_inner = _rnet->is_inner(src); 
        // if cab stops at src before r.src() add 1 to r.detours() if src is on a inner edge
        // add 2 to r.detours() if src is on a outer edge
        // this accounts for the longer drive
        if(!found_src && (_rnet->in_between(_position, r.src(), src) || 
                _rnet->in_between(r.src(), r.dst(), src)))
        {
            cost = is_inner ? cost + 1 : cost + 2;
        }

        is_inner = _rnet->is_inner(dst); 
        // same as above but with dst
        if(!found_dst && (_rnet->in_between(_position, r.src(), dst) || 
                _rnet->in_between(r.src(), r.dst(), dst)))
        {
            cost = is_inner ? cost + 1 : cost + 2;
        }
        
        max = cost > max ? cost : max;
    }

    return max;
}